

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

QString * __thiscall QMakeLocalFileName::local(QMakeLocalFileName *this)

{
  char16_t *pcVar1;
  QArrayData *pQVar2;
  QString string;
  long in_FS_OFFSET;
  Data *in_stack_ffffffffffffffb8;
  char16_t *in_stack_ffffffffffffffc0;
  qsizetype in_stack_ffffffffffffffc8;
  QArrayData *local_30;
  char16_t *local_28;
  qsizetype local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->real_name).d.ptr;
  if ((pcVar1 != (char16_t *)0x0) && ((this->local_name).d.ptr == (char16_t *)0x0)) {
    local_30 = &((this->real_name).d.d)->super_QArrayData;
    local_20 = (this->real_name).d.size;
    if (local_30 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_30->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_30->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string.d.ptr = in_stack_ffffffffffffffc0;
    string.d.d = in_stack_ffffffffffffffb8;
    string.d.size = in_stack_ffffffffffffffc8;
    local_28 = pcVar1;
    Option::fixString((QString *)&stack0xffffffffffffffb8,string,(uchar)&local_30);
    if (local_30 != (QArrayData *)0x0) {
      LOCK();
      (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30,2,0x10);
      }
    }
    pQVar2 = &((this->local_name).d.d)->super_QArrayData;
    (this->local_name).d.d = in_stack_ffffffffffffffb8;
    (this->local_name).d.ptr = in_stack_ffffffffffffffc0;
    (this->local_name).d.size = in_stack_ffffffffffffffc8;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return &this->local_name;
  }
  __stack_chk_fail();
}

Assistant:

const QString
&QMakeLocalFileName::local() const
{
    if (!isNull() && local_name.isNull())
        local_name = Option::normalizePath(real_name);
    return local_name;
}